

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * __thiscall
Lowerer::GetForInEnumeratorFieldOpnd
          (Lowerer *this,Opnd *forInEnumeratorOpnd,uint fieldOffset,IRType type)

{
  code *pcVar1;
  bool bVar2;
  SymOpnd *pSVar3;
  StackSym *sym;
  undefined4 *puVar4;
  IndirOpnd *pIVar5;
  
  bVar2 = IR::Opnd::IsSymOpnd(forInEnumeratorOpnd);
  if (bVar2) {
    pSVar3 = IR::Opnd::AsSymOpnd(forInEnumeratorOpnd);
    sym = IR::Opnd::GetStackSym(&pSVar3->super_Opnd);
    pSVar3 = IR::SymOpnd::New(&sym->super_Sym,fieldOffset + pSVar3->m_offset,type,this->m_func);
    return &pSVar3->super_Opnd;
  }
  bVar2 = IR::Opnd::IsIndirOpnd(forInEnumeratorOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2704,"(forInEnumeratorOpnd->IsIndirOpnd())",
                       "forInEnumeratorOpnd->IsIndirOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar5 = IR::Opnd::AsIndirOpnd(forInEnumeratorOpnd);
  pIVar5 = IR::IndirOpnd::New(pIVar5->m_baseOpnd,fieldOffset + pIVar5->m_offset,type,this->m_func,
                              false);
  return &pIVar5->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::GetForInEnumeratorFieldOpnd(IR::Opnd * forInEnumeratorOpnd, uint fieldOffset, IRType type)
{
    if (forInEnumeratorOpnd->IsSymOpnd())
    {
        IR::SymOpnd * symOpnd = forInEnumeratorOpnd->AsSymOpnd();
        return IR::SymOpnd::New(symOpnd->GetStackSym(), symOpnd->m_offset + fieldOffset, type, this->m_func);
    }
    Assert(forInEnumeratorOpnd->IsIndirOpnd());
    IR::IndirOpnd * indirOpnd = forInEnumeratorOpnd->AsIndirOpnd();
    return IR::IndirOpnd::New(indirOpnd->GetBaseOpnd(), indirOpnd->GetOffset() + fieldOffset, type, this->m_func);
}